

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::FieldGeneratorBase::GenerateMemberConstexprConstructor
          (FieldGeneratorBase *this,Printer *p)

{
  byte bVar1;
  undefined8 extraout_RAX;
  bool bVar2;
  ulong uVar3;
  anon_class_1_0_00000001 local_111;
  string local_110;
  string local_f0;
  Sub local_d0;
  FieldDescriptor *field;
  
  bVar1 = this->field_->field_0x1;
  if ((bVar1 & 8) == 0) {
    uVar3 = CONCAT71((int7)((ulong)this->field_ >> 8),bVar1) & 0xffffff20;
    bVar2 = (bool)((byte)uVar3 >> 5);
    field = (FieldDescriptor *)CONCAT71((int7)(uVar3 >> 8),bVar2);
    if (0xbf < bVar1 == bVar2) {
      if ((bVar1 & 0x20) != 0) {
        io::Printer::Emit(p,0,0,9,"$name$_{}");
        return;
      }
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"default","");
      DefaultValue_abi_cxx11_(&local_f0,(cpp *)this->options_,(Options *)this->field_,field);
      io::Printer::Sub::Sub<std::__cxx11::string>(&local_d0,&local_110,&local_f0);
      io::Printer::Emit(p,&local_d0,1,0x12,"$name$_{$default$}");
      if (local_d0.annotation_.
          super__Optional_base<google::protobuf::io::Printer::AnnotationRecord,_false,_false>.
          _M_payload.
          super__Optional_payload<google::protobuf::io::Printer::AnnotationRecord,_true,_false,_false>
          .super__Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>._M_engaged
          == true) {
        std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                  ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                   &local_d0.annotation_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0.value_.consume_after._M_dataplus._M_p !=
          &local_d0.value_.consume_after.field_2) {
        operator_delete(local_d0.value_.consume_after._M_dataplus._M_p,
                        local_d0.value_.consume_after.field_2._M_allocated_capacity + 1);
      }
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
        ::_S_vtable._M_arr
        [local_d0.value_.value.
         super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
         .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
         super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
         super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
         super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
         super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
         _M_index]._M_data)(&local_111,&local_d0.value_.value);
      local_d0.value_.value.
      super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
      .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
      super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
      super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
      super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
      super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
      _M_index = 0xff;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0.key_._M_dataplus._M_p != &local_d0.key_.field_2) {
        operator_delete(local_d0.key_._M_dataplus._M_p,
                        local_d0.key_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
      return;
    }
  }
  else {
    GenerateMemberConstexprConstructor();
  }
  GenerateMemberConstexprConstructor();
  __clang_call_terminate(extraout_RAX);
}

Assistant:

void FieldGeneratorBase::GenerateMemberConstexprConstructor(
    io::Printer* p) const {
  ABSL_CHECK(!field_->is_extension());
  if (field_->is_repeated()) {
    p->Emit("$name$_{}");
  } else {
    p->Emit({{"default", DefaultValue(options_, field_)}},
            "$name$_{$default$}");
  }
}